

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

ProStringList * __thiscall
MakefileGenerator::createObjectList
          (ProStringList *__return_storage_ptr__,MakefileGenerator *this,ProStringList *sources)

{
  QMakeProject *pQVar1;
  long lVar2;
  QString string;
  QString file;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  qsizetype qVar6;
  char16_t *pcVar7;
  QHash<QString,_bool> QVar8;
  QArrayData *pQVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  ProStringList *pPVar13;
  __mode_t __mode;
  SourceFiles *pSVar14;
  MakefileGenerator *this_00;
  ProString *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QStringView config;
  QFileInfo fi;
  undefined8 in_stack_fffffffffffffea8;
  QStringBuilder<const_char_(&)[3],_QString_&> local_138;
  Data *local_128;
  undefined1 local_118 [56];
  _func_int **local_e0;
  undefined1 local_d8 [32];
  QString *local_b8;
  QString local_a8;
  ProString local_88;
  QHash<QString,_bool> local_58;
  QArrayData *pQStack_50;
  SourceFiles *local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  local_48 = (SourceFiles *)0x0;
  local_58.d = (Data *)0x0;
  pQStack_50 = (QArrayData *)0x0;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"OBJECTS_DIR");
  pPVar13 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  lVar2 = (pPVar13->super_QList<ProString>).d.size;
  if ((Data *)local_88.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar2 != 0) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)local_d8,"OBJECTS_DIR");
    QMakeEvaluator::first(&local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
    ProString::toQString(&local_a8,&local_88);
    pQVar9 = pQStack_50;
    QVar8.d = local_58.d;
    qVar6 = local_a8.d.size;
    pDVar5 = local_a8.d.d;
    local_a8.d.d = (Data *)local_58.d;
    local_58.d = (Data *)pDVar5;
    pQStack_50 = (QArrayData *)local_a8.d.ptr;
    local_a8.d.ptr = (char16_t *)pQVar9;
    local_a8.d.size = (qsizetype)local_48;
    local_48 = (SourceFiles *)qVar6;
    if (QVar8.d != (Data *)0x0) {
      LOCK();
      ((QVar8.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((QVar8.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar8.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)QVar8.d,2,0x10);
      }
    }
    if ((Data *)local_88.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Data *)local_d8._0_8_ != (Data *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
      }
    }
  }
  if ((sources->super_QList<ProString>).d.size != 0) {
    this_01 = (sources->super_QList<ProString>).d.ptr;
    do {
      local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString(&local_a8,this_01);
      local_e0 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_88.m_string.d.d = local_a8.d.d;
      local_88.m_string.d.ptr = local_a8.d.ptr;
      local_88.m_string.d.size = local_a8.d.size;
      if ((Data *)local_a8.d.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string.d.ptr = (char16_t *)this;
      string.d.d = (Data *)in_stack_fffffffffffffea8;
      string.d.size = (qsizetype)sources;
      Option::fixString((QString *)(local_118 + 0x20),string,(uchar)&local_88);
      if ((Data *)local_88.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      file.d.ptr = (char16_t *)this;
      file.d.d = (Data *)in_stack_fffffffffffffea8;
      file.d.size = (qsizetype)sources;
      fileInfo((MakefileGenerator *)&local_e0,file);
      if ((Span *)local_118._32_8_ != (Span *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_118._32_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_118._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_118._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_118._32_8_,2,0x10);
        }
      }
      local_118._0_8_ = (QArrayData *)0x0;
      local_118._8_8_ = (char16_t *)0x0;
      local_118._16_8_ = 0;
      pQVar1 = this->project;
      QVar15.m_data = (storage_type *)0x19;
      QVar15.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar15);
      pDVar5 = local_88.m_string.d.d;
      config.m_data = local_88.m_string.d.ptr;
      config.m_size = local_88.m_string.d.size;
      bVar10 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
      if ((Data *)pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      if (bVar10) {
        local_88.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        fileFixify(&local_88.m_string,this,&local_a8,(FileFixifyTypes)0x3,true);
        local_138.a = (char (*) [3])0x2b2b84;
        local_138.b = &Option::dir_sep;
        QStringBuilder<const_char_(&)[3],_QString_&>::convertTo<QString>
                  ((QString *)local_d8,&local_138);
        cVar11 = QString::startsWith((QString *)&local_88,
                                     (CaseSensitivity)(MakefileGenerator *)local_d8);
        uVar3 = local_d8._0_8_;
        if ((Data *)local_d8._0_8_ != (Data *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
          }
        }
        if (cVar11 != '\0') {
          fileFixify((QString *)local_d8,this,&local_88.m_string,(FileFixifyTypes)0x4,true);
          pcVar7 = local_88.m_string.d.ptr;
          pDVar5 = local_88.m_string.d.d;
          uVar4 = local_d8._16_8_;
          uVar3 = local_d8._0_8_;
          local_d8._0_8_ = local_88.m_string.d.d;
          local_88.m_string.d.d = (Data *)uVar3;
          local_88.m_string.d.ptr = (char16_t *)local_d8._8_8_;
          local_d8._8_8_ = pcVar7;
          local_d8._16_8_ = local_88.m_string.d.size;
          local_88.m_string.d.size = uVar4;
          if ((Data *)pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
            }
          }
        }
        cVar11 = QDir::isRelativePath((QString *)&local_88);
        if (cVar11 == '\0') {
          QString::indexOf((QString *)&local_88,0x2e5bf0,CaseInsensitive);
          QString::remove((longlong)&local_88,0);
        }
        QString::operator=((QString *)local_118,(QString *)&local_58);
        iVar12 = QString::lastIndexOf
                           ((QString *)&local_88,0x2e5bf0,(CaseSensitivity)local_88.m_string.d.size)
        ;
        if (iVar12 != -1) {
          QString::append((QChar *)local_118,(longlong)local_88.m_string.d.ptr);
        }
        if (this->no_io == false) {
          local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          this_00 = (MakefileGenerator *)local_d8;
          fileFixify((QString *)local_d8,this,(QString *)local_118,(FileFixifyTypes)0x3,true);
          if (((SourceFiles *)local_d8._16_8_ != (SourceFiles *)0x0) &&
             (iVar12 = mkdir(this_00,(char *)local_d8,__mode), (char)iVar12 == '\0')) {
            QString::toLatin1_helper((QString *)&local_138);
            pSVar14 = (SourceFiles *)local_138.b;
            if ((SourceFiles *)local_138.b == (SourceFiles *)0x0) {
              pSVar14 = (SourceFiles *)&QByteArray::_empty;
            }
            warn_msg(WarnLogic,"Cannot create directory \'%s\'",pSVar14);
            if ((QArrayData *)local_138.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_138.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_138.a)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_138.a)->_q_value).super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)local_138.a,1,0x10);
              }
            }
          }
          if ((Data *)local_d8._0_8_ != (Data *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
            }
          }
        }
        pDVar5 = local_88.m_string.d.d;
        if ((Data *)local_88.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        QString::operator=((QString *)local_118,(QString *)&local_58);
      }
      QFileInfo::completeBaseName();
      local_d8._24_8_ = local_128;
      local_d8._16_8_ = local_138.b;
      local_d8._8_8_ = local_138.a;
      local_128 = (Data *)0x0;
      local_138.a = (char (*) [3])0x0;
      local_138.b = (QString *)0x0;
      local_b8 = &Option::obj_ext;
      local_d8._0_8_ = (Data *)local_118;
      ProString::ProString<QStringBuilder<QString&,QString>,QString&>
                (&local_88,(QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> *)local_d8
                );
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super_QList<ProString>).d.size,&local_88);
      QList<ProString>::end(&__return_storage_ptr__->super_QList<ProString>);
      pDVar5 = local_88.m_string.d.d;
      if ((Data *)local_88.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_138.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)*local_138.a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)*local_138.a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)*local_138.a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138.a,2,0x10);
        }
      }
      if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_e0);
      if ((Data *)local_a8.d.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             (sources->super_QList<ProString>).d.ptr + (sources->super_QList<ProString>).d.size);
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58.d,2,0x10);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
MakefileGenerator::createObjectList(const ProStringList &sources)
{
    ProStringList ret;
    QString objdir;
    if(!project->values("OBJECTS_DIR").isEmpty())
        objdir = project->first("OBJECTS_DIR").toQString();
    for (ProStringList::ConstIterator it = sources.begin(); it != sources.end(); ++it) {
        QString sfn = (*it).toQString();
        QFileInfo fi(fileInfo(Option::normalizePath(sfn)));
        QString dir;
        if (project->isActiveConfig("object_parallel_to_source")) {
            // The source paths are relative to the output dir, but we need source-relative paths
            QString sourceRelativePath = fileFixify(sfn, FileFixifyBackwards);

            if (sourceRelativePath.startsWith(".." + Option::dir_sep))
                sourceRelativePath = fileFixify(sourceRelativePath, FileFixifyAbsolute);

            if (QDir::isAbsolutePath(sourceRelativePath))
                sourceRelativePath.remove(0, sourceRelativePath.indexOf(Option::dir_sep) + 1);

            dir = objdir; // We still respect OBJECTS_DIR

            int lastDirSepPosition = sourceRelativePath.lastIndexOf(Option::dir_sep);
            if (lastDirSepPosition != -1)
                dir += QStringView{sourceRelativePath}.left(lastDirSepPosition + 1);

            if (!noIO()) {
                // Ensure that the final output directory of each object exists
                QString outRelativePath = fileFixify(dir, FileFixifyBackwards);
                if (!outRelativePath.isEmpty() && !mkdir(outRelativePath))
                    warn_msg(WarnLogic, "Cannot create directory '%s'", outRelativePath.toLatin1().constData());
            }
        } else {
            dir = objdir;
        }
        ret.append(dir + fi.completeBaseName() + Option::obj_ext);
    }
    return ret;
}